

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

ostream * CS248::operator<<(ostream *os,Matrix4x4 *A)

{
  ostream *poVar1;
  int i;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
    lVar3 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(*(double *)((long)A + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x80);
    std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    std::ostream::put((char)os);
    std::ostream::flush();
    lVar2 = lVar2 + 1;
    A = (Matrix4x4 *)((long)A + 8);
  } while (lVar2 != 4);
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Matrix4x4& A ) {
    for( int i = 0; i < 4; i++ )
    {
       os << "[ ";

       for( int j = 0; j < 4; j++ )
       {
          os << A(i,j) << " ";
       }

       os << "]" << std::endl;
    }

    return os;
  }